

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O0

string * __thiscall
testing::internal::ConvertIdentifierNameToWords_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *id_name)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  bool local_56;
  bool local_52;
  internal *piStack_28;
  bool starts_new_word;
  char *p;
  char prev_char;
  char *id_name_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  p._6_1_ = (internal)0x0;
  piStack_28 = this;
  do {
    if (*piStack_28 == (internal)0x0) {
      return __return_storage_ptr__;
    }
    bVar1 = IsUpper((char)*piStack_28);
    local_52 = true;
    if (!bVar1) {
      bVar1 = IsAlpha((char)p._6_1_);
      if (!bVar1) {
        bVar1 = IsLower((char)*piStack_28);
        local_52 = true;
        if (bVar1) goto LAB_00112723;
      }
      bVar1 = IsDigit((char)p._6_1_);
      local_56 = false;
      if (!bVar1) {
        local_56 = IsDigit((char)*piStack_28);
      }
      local_52 = local_56;
    }
LAB_00112723:
    bVar1 = IsAlNum((char)*piStack_28);
    if (bVar1) {
      if ((local_52 != false) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
      }
      cVar2 = ToLower((char)*piStack_28);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
    }
    p._6_1_ = *piStack_28;
    piStack_28 = piStack_28 + 1;
  } while( true );
}

Assistant:

GTEST_API_ std::string ConvertIdentifierNameToWords(const char* id_name) {
  std::string result;
  char prev_char = '\0';
  for (const char* p = id_name; *p != '\0'; prev_char = *(p++)) {
    // We don't care about the current locale as the input is
    // guaranteed to be a valid C++ identifier name.
    const bool starts_new_word = IsUpper(*p) ||
                                 (!IsAlpha(prev_char) && IsLower(*p)) ||
                                 (!IsDigit(prev_char) && IsDigit(*p));

    if (IsAlNum(*p)) {
      if (starts_new_word && !result.empty()) result += ' ';
      result += ToLower(*p);
    }
  }
  return result;
}